

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Table * sqlite3SrcListLookup(Parse *pParse,SrcList *pSrc)

{
  u32 *puVar1;
  undefined1 *puVar2;
  Table *pTable;
  sqlite3 *db;
  int iVar3;
  Table *pTVar4;
  
  pTVar4 = sqlite3LocateTableItem(pParse,0,pSrc->a);
  pTable = pSrc->a[0].pSTab;
  if (pTable != (Table *)0x0) {
    db = pParse->db;
    if (db->pnBytesFreed == (int *)0x0) {
      puVar1 = &pTable->nTabRef;
      *puVar1 = *puVar1 - 1;
      if (*puVar1 != 0) goto LAB_001874c9;
    }
    deleteTable(db,pTable);
  }
LAB_001874c9:
  pSrc->a[0].pSTab = pTVar4;
  puVar2 = &pSrc->a[0].fg.field_0x2;
  *puVar2 = *puVar2 | 4;
  if (pTVar4 == (Table *)0x0) {
    pTVar4 = (Table *)0x0;
  }
  else {
    pTVar4->nTabRef = pTVar4->nTabRef + 1;
    if ((pSrc->a[0].fg.field_0x1 & 2) != 0) {
      iVar3 = sqlite3IndexedByLookup(pParse,pSrc->a);
      if (iVar3 != 0) {
        pTVar4 = (Table *)0x0;
      }
    }
  }
  return pTVar4;
}

Assistant:

SQLITE_PRIVATE Table *sqlite3SrcListLookup(Parse *pParse, SrcList *pSrc){
  SrcItem *pItem = pSrc->a;
  Table *pTab;
  assert( pItem && pSrc->nSrc>=1 );
  pTab = sqlite3LocateTableItem(pParse, 0, pItem);
  if( pItem->pSTab ) sqlite3DeleteTable(pParse->db, pItem->pSTab);
  pItem->pSTab = pTab;
  pItem->fg.notCte = 1;
  if( pTab ){
    pTab->nTabRef++;
    if( pItem->fg.isIndexedBy && sqlite3IndexedByLookup(pParse, pItem) ){
      pTab = 0;
    }
  }
  return pTab;
}